

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool-options.h
# Opt level: O2

void __thiscall
wasm::ToolOptions::ToolOptions(ToolOptions *this,string *command,string *description)

{
  Options *this_00;
  string *psVar1;
  ToolOptions *pTVar2;
  _Any_data local_8e8;
  code *local_8d8;
  code *local_8d0;
  _Any_data local_8c8;
  code *local_8b8;
  code *local_8b0;
  _Any_data local_8a8;
  code *local_898;
  code *local_890;
  _Any_data local_888;
  code *local_878;
  code *local_870;
  _Any_data local_868;
  code *local_858;
  code *local_850;
  string local_848 [32];
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  string local_668 [32];
  string local_648 [32];
  allocator<char> local_628 [32];
  allocator<char> local_608 [32];
  allocator<char> local_5e8 [32];
  allocator<char> local_5c8 [32];
  allocator<char> local_5a8 [32];
  allocator<char> local_588 [32];
  allocator<char> local_568 [32];
  allocator<char> local_548 [32];
  allocator<char> local_528 [32];
  allocator<char> local_508 [32];
  allocator<char> local_4e8 [32];
  allocator<char> local_4c8 [32];
  allocator<char> local_4a8 [32];
  allocator<char> local_488 [32];
  allocator<char> local_468 [32];
  allocator<char> local_448 [32];
  _Any_data local_428;
  code *local_418;
  code *local_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  _Any_data local_3e8;
  code *local_3d8;
  code *local_3d0;
  _Any_data local_3c8;
  code *local_3b8;
  code *local_3b0;
  _Any_data local_3a8;
  code *local_398;
  code *local_390;
  _Any_data local_388;
  code *local_378;
  code *local_370;
  _Any_data local_368;
  code *local_358;
  code *local_350;
  _Any_data local_348;
  code *local_338;
  code *local_330;
  _Any_data local_328;
  code *local_318;
  code *local_310;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0 [32];
  string local_a0 [32];
  Options *local_80;
  PassOptions *local_78;
  allocator<char> local_6a;
  allocator<char> local_69;
  allocator<char> local_68;
  allocator<char> local_67;
  allocator<char> local_66;
  allocator<char> local_65;
  allocator<char> local_64;
  allocator<char> local_63;
  allocator<char> local_62;
  allocator<char> local_61;
  allocator<char> local_60;
  allocator<char> local_5f;
  allocator<char> local_5e;
  allocator<char> local_5d;
  allocator<char> local_5c;
  allocator<char> local_5b;
  allocator<char> local_5a;
  allocator<char> local_59;
  allocator<char> local_58;
  allocator<char> local_57;
  allocator<char> local_56;
  allocator<char> local_55;
  allocator<char> local_54;
  allocator<char> local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  allocator<char> local_50;
  allocator<char> local_4f;
  allocator<char> local_4e;
  allocator<char> local_4d;
  allocator<char> local_4c;
  allocator<char> local_4b;
  allocator<char> local_4a;
  allocator<char> local_49;
  allocator<char> local_48;
  allocator<char> local_47;
  allocator<char> local_46;
  allocator<char> local_45;
  allocator<char> local_44;
  allocator<char> local_43;
  allocator<char> local_42;
  allocator<char> local_41;
  allocator<char> local_40;
  allocator<char> local_3f;
  allocator<char> local_3e;
  allocator<char> local_3d;
  allocator<char> local_3c;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  allocator<char> local_38;
  allocator<char> local_37;
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  this_00 = &this->super_Options;
  wasm::Options::Options(this_00,(string *)command,(string *)description);
  this->_vptr_ToolOptions = (_func_int **)&PTR_addPassArg_00142bf0;
  PassOptions::PassOptions(&this->passOptions);
  this->quiet = false;
  this->preserveTypeOrder = false;
  this->profile = Normal;
  this->enabledFeatures = 0x22;
  (this->disabledFeatures).features = 0;
  local_80 = this_00;
  local_78 = &this->passOptions;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"--mvp-features",local_628);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"-mvp",(allocator<char> *)local_328._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"Disable all non-MVP features",local_608);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"Tool options",local_5e8);
  local_408._8_8_ = 0;
  local_3f0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:47:12)>
              ::_M_invoke;
  local_3f8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:47:12)>
              ::_M_manager;
  local_408._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add((string *)this_00,(string *)&local_300,(string *)&local_2e0,
                              (string *)&local_2c0,(Arguments)&local_2a0,(function *)0x0,
                              SUB81(&local_408,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"--all-features",local_5c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"-all",local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Enable all features",(allocator<char> *)local_428._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Tool options",local_588);
  local_3e8._8_8_ = 0;
  local_3d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:56:12)>
              ::_M_invoke;
  local_3d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:56:12)>
              ::_M_manager;
  local_3e8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_280,(string *)&local_260,(string *)&local_240,
                              (Arguments)&local_220,(function *)0x0,SUB81(&local_3e8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"--detect-features",local_568);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",local_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"(deprecated - this flag does nothing)",local_528);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"Tool options",(allocator<char> *)local_388._M_pod_data);
  local_348._M_unused._M_object = (void *)0x0;
  local_348._8_8_ = 0;
  local_330 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:65:12)>
              ::_M_invoke;
  local_338 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:65:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_200,(string *)&local_1e0,(string *)&local_1c0,
                              (Arguments)&local_1a0,(function *)0x0,SUB81(&local_348,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"--quiet",local_508);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"-q",local_4e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"Emit less verbose output and hide trivial warnings.",local_4c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Tool options",local_4a8);
  local_3c8._8_8_ = 0;
  local_3b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:71:12)>
              ::_M_invoke;
  local_3b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:71:12)>
              ::_M_manager;
  local_3c8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)&local_180,(string *)&local_160,(string *)&local_140,
                              (Arguments)&local_120,(function *)0x0,SUB81(&local_3c8,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"--experimental-poppy",(allocator<char> *)local_368._M_pod_data);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",local_488);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"Parse wast files as Poppy IR for testing purposes.",local_468);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"Tool options",local_448);
  local_3a8._8_8_ = 0;
  local_390 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:78:9)>
              ::_M_invoke;
  local_398 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:78:9)>
              ::_M_manager;
  local_3a8._M_unused._M_object = this;
  wasm::Options::add(psVar1,(string *)&local_100,(string *)&local_e0,local_c0,(Arguments)local_a0,
                     (function *)0x0,SUB81(&local_3a8,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_3a8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::_Function_base::~_Function_base((_Function_base *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::_Function_base::~_Function_base((_Function_base *)&local_348);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::_Function_base::~_Function_base((_Function_base *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::_Function_base::~_Function_base((_Function_base *)&local_408);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"sign extension operations",&local_6a);
  pTVar2 = addFeature(this,SignExt,&local_300,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,"atomic operations",&local_69);
  pTVar2 = addFeature(pTVar2,Atomics,&local_2e0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"mutable globals",&local_68);
  pTVar2 = addFeature(pTVar2,MutableGlobals,&local_2c0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"nontrapping float-to-int operations",&local_67);
  pTVar2 = addFeature(pTVar2,TruncSat,&local_2a0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_408._M_pod_data,"SIMD operations and types",&local_66);
  pTVar2 = addFeature(pTVar2,SIMD,(string *)&local_408,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"bulk memory operations",&local_65);
  pTVar2 = addFeature(pTVar2,BulkMemory,&local_280,(FeatureSet)0x80000,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"memory.copy and memory.fill",&local_64);
  pTVar2 = addFeature(pTVar2,BulkMemoryOpt,&local_260,(FeatureSet)0x0,(FeatureSet)0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,
             "LEB encoding of call-indirect (Ignored for compatibility as it has no effect on Binaryen)"
             ,&local_63);
  pTVar2 = addFeature(pTVar2,CallIndirectOverlong,&local_240,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"exception handling operations",&local_62);
  pTVar2 = addFeature(pTVar2,ExceptionHandling,&local_220,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3e8._M_pod_data,"tail call operations",&local_61);
  pTVar2 = addFeature(pTVar2,TailCall,(string *)&local_3e8,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_200,"reference types",&local_60);
  pTVar2 = addFeature(pTVar2,ReferenceTypes,&local_200,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"multivalue functions",&local_5f);
  pTVar2 = addFeature(pTVar2,Multivalue,&local_1e0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"garbage collection",&local_5e);
  pTVar2 = addFeature(pTVar2,GC,&local_1c0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"memory64",&local_5d);
  pTVar2 = addFeature(pTVar2,Memory64,&local_1a0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_348._M_pod_data,"relaxed SIMD",&local_5c);
  pTVar2 = addFeature(pTVar2,RelaxedSIMD,(string *)&local_348,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"extended const expressions",&local_5b);
  pTVar2 = addFeature(pTVar2,ExtendedConst,&local_180,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"strings",&local_5a);
  pTVar2 = addFeature(pTVar2,Strings,&local_160,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"multimemory",&local_59);
  pTVar2 = addFeature(pTVar2,MultiMemory,&local_140,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"stack switching",&local_58);
  pTVar2 = addFeature(pTVar2,StackSwitching,&local_120,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3c8._M_pod_data,"shared-everything threads",&local_57);
  pTVar2 = addFeature(pTVar2,SharedEverything,(string *)&local_3c8,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"float 16 operations",&local_56);
  pTVar2 = addFeature(pTVar2,FP16,&local_100,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"custom descriptors (RTTs) and exact references",&local_55);
  pTVar2 = addFeature(pTVar2,CustomDescriptors,&local_e0,(FeatureSet)0x0,(FeatureSet)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"--enable-typed-function-references",&local_54);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"",&local_53);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_3a8._M_pod_data,"Deprecated compatibility flag",&local_52);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_628,"Tool options",&local_51);
  local_328._M_unused._M_object = (void *)0x0;
  local_328._8_8_ = 0;
  local_310 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:116:12)>
              ::_M_invoke;
  local_318 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:116:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add((string *)&pTVar2->super_Options,local_c0,local_a0,
                              (string *)local_3a8._M_pod_data,(Arguments)local_628,(function *)0x0,
                              SUB81(&local_328,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_608,"--disable-typed-function-references",&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5e8,"",&local_4f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5c8,"Deprecated compatibility flag",&local_4e);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5a8,"Tool options",&local_4d);
  local_428._M_unused._M_object = (void *)0x0;
  local_428._8_8_ = 0;
  local_410 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:126:12)>
              ::_M_invoke;
  local_418 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:126:12)>
              ::_M_manager;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_608,(string *)local_5e8,(string *)local_5c8,
                              (Arguments)local_5a8,(function *)0x0,SUB81(&local_428,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_588,"--no-validation",&local_4c);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_568,"-n",&local_4b);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_548,"Disables validation, assumes inputs are correct",&local_4a);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_528,"Tool options",&local_49);
  local_388._8_8_ = 0;
  local_370 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:136:12)>
              ::_M_invoke;
  local_378 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:136:12)>
              ::_M_manager;
  local_388._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_588,(string *)local_568,(string *)local_548,
                              (Arguments)local_528,(function *)0x0,SUB81(&local_388,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_508,"--pass-arg",&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4e8,"-pa",&local_47);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_4c8,
             "An argument passed along to optimization passes being run. Must be in the form KEY@VALUE.  If KEY is the name of a pass then it applies to the closest instance of that pass before us. If KEY is not the name of a pass then it is a global option that applies to all pass instances that read it."
             ,&local_46);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4a8,"Tool options",&local_45);
  local_368._8_8_ = 0;
  local_350 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_invoke;
  local_358 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:148:12)>
              ::_M_manager;
  local_368._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_508,(string *)local_4e8,(string *)local_4c8,
                              (Arguments)local_4a8,(function *)0x2,SUB81(&local_368,0));
  std::__cxx11::string::string<std::allocator<char>>((string *)local_488,"--closed-world",&local_44)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_468,"-cw",&local_43);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_448,
             "Assume code outside of the module does not inspect or interact with GC and function references, even if they are passed out. The outside may hold on to them and pass them back in, but not inspect their contents or call them."
             ,&local_42);
  std::__cxx11::string::string<std::allocator<char>>(local_848,"Tool options",&local_41);
  local_8e8._8_8_ = 0;
  local_8d0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:170:9)>
              ::_M_invoke;
  local_8d8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:170:9)>
              ::_M_manager;
  local_8e8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,(string *)local_488,(string *)local_468,(string *)local_448,
                              (Arguments)local_848,(function *)0x0,SUB81(&local_8e8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_828,"--preserve-type-order",&local_40);
  std::__cxx11::string::string<std::allocator<char>>(local_808,"",&local_3f);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7e8,
             "Preserve the order of types from the input (useful for debugging and testing)",
             &local_3e);
  std::__cxx11::string::string<std::allocator<char>>(local_7c8,"Tool options",&local_3d);
  local_8c8._8_8_ = 0;
  local_8b0 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:180:9)>
              ::_M_invoke;
  local_8b8 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:180:9)>
              ::_M_manager;
  local_8c8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_828,local_808,local_7e8,(Arguments)local_7c8,
                              (function *)0x0,SUB81(&local_8c8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_7a8,"--generate-stack-ir",&local_3c);
  std::__cxx11::string::string<std::allocator<char>>(local_788,"",&local_3b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_768,"generate StackIR during writing",&local_3a);
  std::__cxx11::string::string<std::allocator<char>>(local_748,"Tool options",&local_39);
  local_8a8._8_8_ = 0;
  local_890 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:188:12)>
              ::_M_invoke;
  local_898 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:188:12)>
              ::_M_manager;
  local_8a8._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_7a8,local_788,local_768,(Arguments)local_748,
                              (function *)0x0,SUB81(&local_8a8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_728,"--optimize-stack-ir",&local_38);
  std::__cxx11::string::string<std::allocator<char>>(local_708,"",&local_37);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6e8,"optimize StackIR during writing",&local_36);
  std::__cxx11::string::string<std::allocator<char>>(local_6c8,"Tool options",&local_35);
  local_888._8_8_ = 0;
  local_870 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:196:12)>
              ::_M_invoke;
  local_878 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:196:12)>
              ::_M_manager;
  local_888._M_unused._M_object = this;
  psVar1 = (string *)
           wasm::Options::add(psVar1,local_728,local_708,local_6e8,(Arguments)local_6c8,
                              (function *)0x0,SUB81(&local_888,0));
  std::__cxx11::string::string<std::allocator<char>>(local_6a8,"--print-stack-ir",&local_34);
  std::__cxx11::string::string<std::allocator<char>>(local_688,"",&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            (local_668,"print StackIR during writing",&local_32);
  std::__cxx11::string::string<std::allocator<char>>(local_648,"Tool options",&local_31);
  local_868._8_8_ = 0;
  local_850 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:206:12)>
              ::_M_invoke;
  local_858 = std::
              _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/tool-options.h:206:12)>
              ::_M_manager;
  local_868._M_unused._M_object = this;
  wasm::Options::add(psVar1,local_6a8,local_688,local_668,(Arguments)local_648,(function *)0x0,
                     SUB81(&local_868,0));
  std::_Function_base::~_Function_base((_Function_base *)&local_868);
  std::__cxx11::string::~string(local_648);
  std::__cxx11::string::~string(local_668);
  std::__cxx11::string::~string(local_688);
  std::__cxx11::string::~string(local_6a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_888);
  std::__cxx11::string::~string(local_6c8);
  std::__cxx11::string::~string(local_6e8);
  std::__cxx11::string::~string(local_708);
  std::__cxx11::string::~string(local_728);
  std::_Function_base::~_Function_base((_Function_base *)&local_8a8);
  std::__cxx11::string::~string(local_748);
  std::__cxx11::string::~string(local_768);
  std::__cxx11::string::~string(local_788);
  std::__cxx11::string::~string(local_7a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_8c8);
  std::__cxx11::string::~string(local_7c8);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string(local_808);
  std::__cxx11::string::~string(local_828);
  std::_Function_base::~_Function_base((_Function_base *)&local_8e8);
  std::__cxx11::string::~string(local_848);
  std::__cxx11::string::~string((string *)local_448);
  std::__cxx11::string::~string((string *)local_468);
  std::__cxx11::string::~string((string *)local_488);
  std::_Function_base::~_Function_base((_Function_base *)&local_368);
  std::__cxx11::string::~string((string *)local_4a8);
  std::__cxx11::string::~string((string *)local_4c8);
  std::__cxx11::string::~string((string *)local_4e8);
  std::__cxx11::string::~string((string *)local_508);
  std::_Function_base::~_Function_base((_Function_base *)&local_388);
  std::__cxx11::string::~string((string *)local_528);
  std::__cxx11::string::~string((string *)local_548);
  std::__cxx11::string::~string((string *)local_568);
  std::__cxx11::string::~string((string *)local_588);
  std::_Function_base::~_Function_base((_Function_base *)&local_428);
  std::__cxx11::string::~string((string *)local_5a8);
  std::__cxx11::string::~string((string *)local_5c8);
  std::__cxx11::string::~string((string *)local_5e8);
  std::__cxx11::string::~string((string *)local_608);
  std::_Function_base::~_Function_base((_Function_base *)&local_328);
  std::__cxx11::string::~string((string *)local_628);
  std::__cxx11::string::~string((string *)local_3a8._M_pod_data);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_3c8._M_pod_data);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)local_348._M_pod_data);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)local_3e8._M_pod_data);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)local_408._M_pod_data);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  return;
}

Assistant:

ToolOptions(const std::string& command, const std::string& description)
    : Options(command, description) {
    (*this)
      .add("--mvp-features",
           "-mvp",
           "Disable all non-MVP features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setMVP();
             disabledFeatures.setAll();
           })
      .add("--all-features",
           "-all",
           "Enable all features",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) {
             enabledFeatures.setAll();
             disabledFeatures.setMVP();
           })
      .add("--detect-features",
           "",
           "(deprecated - this flag does nothing)",
           ToolOptionsCategory,
           Arguments::Zero,
           [](Options*, const std::string&) {})
      .add("--quiet",
           "-q",
           "Emit less verbose output and hide trivial warnings.",
           ToolOptionsCategory,
           Arguments::Zero,
           [this](Options*, const std::string&) { quiet = true; })
      .add(
        "--experimental-poppy",
        "",
        "Parse wast files as Poppy IR for testing purposes.",
        ToolOptionsCategory,
        Arguments::Zero,
        [this](Options*, const std::string&) { profile = IRProfile::Poppy; });
    (*this)
      .addFeature(FeatureSet::SignExt, "sign extension operations")
      .addFeature(FeatureSet::Atomics, "atomic operations")
      .addFeature(FeatureSet::MutableGlobals, "mutable globals")
      .addFeature(FeatureSet::TruncSat, "nontrapping float-to-int operations")
      .addFeature(FeatureSet::SIMD, "SIMD operations and types")
      .addFeature(FeatureSet::BulkMemory,
                  "bulk memory operations",
                  FeatureSet(FeatureSet::BulkMemoryOpt))
      .addFeature(FeatureSet::BulkMemoryOpt,
                  "memory.copy and memory.fill",
                  FeatureSet::None,
                  FeatureSet(FeatureSet::BulkMemory))
      .addFeature(FeatureSet::CallIndirectOverlong,
                  "LEB encoding of call-indirect (Ignored for compatibility as "
                  "it has no effect on Binaryen)")
      .addFeature(FeatureSet::ExceptionHandling,
                  "exception handling operations")
      .addFeature(FeatureSet::TailCall, "tail call operations")
      .addFeature(FeatureSet::ReferenceTypes, "reference types")
      .addFeature(FeatureSet::Multivalue, "multivalue functions")
      .addFeature(FeatureSet::GC, "garbage collection")
      .addFeature(FeatureSet::Memory64, "memory64")
      .addFeature(FeatureSet::RelaxedSIMD, "relaxed SIMD")
      .addFeature(FeatureSet::ExtendedConst, "extended const expressions")
      .addFeature(FeatureSet::Strings, "strings")
      .addFeature(FeatureSet::MultiMemory, "multimemory")
      .addFeature(FeatureSet::StackSwitching, "stack switching")
      .addFeature(FeatureSet::SharedEverything, "shared-everything threads")
      .addFeature(FeatureSet::FP16, "float 16 operations")
      .addFeature(FeatureSet::CustomDescriptors,
                  "custom descriptors (RTTs) and exact references")
      .add("--enable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --enable-typed-function-references is deprecated\n";
           })
      .add("--disable-typed-function-references",
           "",
           "Deprecated compatibility flag",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [](Options* o, const std::string& argument) {
             std::cerr
               << "Warning: Typed function references have been made part of "
                  "GC and --disable-typed-function-references is deprecated\n";
           })
      .add("--no-validation",
           "-n",
           "Disables validation, assumes inputs are correct",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [this](Options* o, const std::string& argument) {
             passOptions.validate = false;
           })
      .add("--pass-arg",
           "-pa",
           "An argument passed along to optimization passes being run. Must be "
           "in the form KEY@VALUE.  If KEY is the name of a pass then it "
           "applies to the closest instance of that pass before us. If KEY is "
           "not the name of a pass then it is a global option that applies to "
           "all pass instances that read it.",
           ToolOptionsCategory,
           Options::Arguments::N,
           [this](Options*, const std::string& argument) {
             std::string key, value;
             auto colon = argument.find('@');
             if (colon == std::string::npos) {
               key = argument;
               value = "1";
             } else {
               key = argument.substr(0, colon);
               value = argument.substr(colon + 1);
             }

             addPassArg(key, value);
           })
      .add(
        "--closed-world",
        "-cw",
        "Assume code outside of the module does not inspect or interact with "
        "GC and function references, even if they are passed out. The outside "
        "may hold on to them and pass them back in, but not inspect their "
        "contents or call them.",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [this](Options*, const std::string&) {
          passOptions.closedWorld = true;
        })
      .add(
        "--preserve-type-order",
        "",
        "Preserve the order of types from the input (useful for debugging and "
        "testing)",
        ToolOptionsCategory,
        Options::Arguments::Zero,
        [&](Options* o, const std::string& arguments) {
          preserveTypeOrder = true;
        })
      .add("--generate-stack-ir",
           "",
           "generate StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             passOptions.generateStackIR = true;
           })
      .add("--optimize-stack-ir",
           "",
           "optimize StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to optimize.
             passOptions.generateStackIR = true;
             passOptions.optimizeStackIR = true;
           })
      .add("--print-stack-ir",
           "",
           "print StackIR during writing",
           ToolOptionsCategory,
           Options::Arguments::Zero,
           [&](Options* o, const std::string& arguments) {
             // Also generate StackIR, to have something to print.
             passOptions.generateStackIR = true;
             passOptions.printStackIR = &std::cout;
           });
  }